

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::HasItem(RecyclableObject *object,uint32 index)

{
  int iVar1;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(object);
  while( true ) {
    if (((object->type).ptr)->typeId == TypeIds_Null) {
      return 0;
    }
    iVar1 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x24])(object,index);
    if (iVar1 != 0) break;
    object = GetPrototypeNoTrap(object);
  }
  return (uint)(iVar1 == 1);
}

Assistant:

BOOL JavascriptOperators::HasItem(RecyclableObject* object, uint32 index)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(object);
#endif
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result;
            if ((result = object->HasItemQuery(index)) != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }
            // CONSIDER: Numeric property values shouldn't be on the prototype for now but if this changes
            // we should add SkipsPrototype support here as well
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        return false;
    }